

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O0

void TPZShapeH1<pzshape::TPZShapeCube>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  int64_t iVar1;
  int *piVar2;
  long in_RDX;
  TPZVec<int> *in_RSI;
  TPZVec<long> *in_RDI;
  int nshapeconnect;
  int i;
  int64_t nshape;
  TPZVec<TPZTransform<double>_> *in_stack_00000088;
  TPZVec<long> *in_stack_00000090;
  int nsides;
  int ncorner;
  size_t in_stack_000002d8;
  char *in_stack_000002e0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  TPZManVector<int,_27> *in_stack_fffffffffffffec0;
  TPZManVector<long,_8> *this;
  int local_12c;
  TPZManVector<int,_27> *in_stack_fffffffffffffed8;
  TPZManVector<int,_27> *in_stack_fffffffffffffee0;
  TPZVec<long> *in_stack_fffffffffffffef8;
  TPZManVector<int,_27> *in_stack_ffffffffffffff00;
  int64_t in_stack_ffffffffffffff28;
  int64_t in_stack_ffffffffffffff30;
  TPZFMatrix<double> *in_stack_ffffffffffffff38;
  
  iVar1 = TPZVec<long>::size(in_RDI);
  if (iVar1 == 8) {
    iVar1 = TPZVec<int>::size(in_RSI);
    if (iVar1 == 0x13) goto LAB_018a0ecc;
  }
  pzinternal::DebugStopImpl(in_stack_000002e0,in_stack_000002d8);
LAB_018a0ecc:
  TPZManVector<int,_27>::TPZManVector
            (in_stack_ffffffffffffff00,(TPZVec<int> *)in_stack_fffffffffffffef8);
  TPZManVector<int,_27>::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  TPZManVector<int,_27>::~TPZManVector(in_stack_fffffffffffffec0);
  ComputeTransforms<pzshape::TPZShapeCube>(in_stack_00000090,in_stack_00000088);
  this = (TPZManVector<long,_8> *)&stack0xfffffffffffffee0;
  TPZManVector<long,_8>::TPZManVector
            ((TPZManVector<long,_8> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  TPZManVector<long,_8>::operator=
            ((TPZManVector<long,_8> *)in_stack_fffffffffffffee0,
             (TPZManVector<long,_8> *)in_stack_fffffffffffffed8);
  TPZManVector<long,_8>::~TPZManVector(this);
  TPZVec<int>::resize((TPZVec<int> *)this,
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  for (local_12c = 8; local_12c < 0x1b; local_12c = local_12c + 1) {
    TPZVec<int>::operator[](in_RSI,(long)local_12c + -8);
    in_stack_fffffffffffffebc =
         pzshape::TPZShapeCube::NConnectShapeF((int)this,in_stack_fffffffffffffebc);
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDX + 0x100),(long)local_12c + -8);
    *piVar2 = in_stack_fffffffffffffebc;
  }
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           const TPZVec<int> &connectorders,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    if((ids.size() != ncorner || connectorders.size() != nsides-ncorner) && TSHAPE::Type() != EPoint)
    {
        DebugStop();
    }
    data.fH1ConnectOrders = connectorders;
    ComputeTransforms<TSHAPE>(ids, data.fSideTransforms);
    data.fCornerNodeIds = ids;
    data.fH1NumConnectShape.resize(TSHAPE::NSides-TSHAPE::NCornerNodes);
    int64_t nshape = TSHAPE::NCornerNodes;
    for(int i = TSHAPE::NCornerNodes; i < TSHAPE::NSides; i++)
    {
        int nshapeconnect = TSHAPE::NConnectShapeF(i,connectorders[i-TSHAPE::NCornerNodes]);
        data.fH1NumConnectShape[i-TSHAPE::NCornerNodes] = nshapeconnect;
        nshape += nshapeconnect;
    }
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(TSHAPE::Dimension, nshape);
//    fNodeIds = ids; Should we make it an attribute of the class?
}